

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O2

int Gia_RsbFindFaninAdd(int iFan,int *pFanins,int *pFaninCounts,int nFanins)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < nFanins) {
    uVar2 = (ulong)(uint)nFanins;
  }
  do {
    uVar3 = uVar2;
    if (uVar2 == uVar1) {
LAB_006236c5:
      pFanins[uVar2] = iFan;
      pFaninCounts[uVar2] = pFaninCounts[uVar2] + 1;
      return (uint)((int)uVar3 == nFanins) + nFanins;
    }
    if (pFanins[uVar1] == iFan) {
      uVar2 = uVar1;
      uVar3 = uVar1 & 0xffffffff;
      goto LAB_006236c5;
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

int Gia_RsbFindFaninAdd( int iFan, int pFanins[32], int pFaninCounts[32], int nFanins )
{
    int i;
    for ( i = 0; i < nFanins; i++ )
        if ( pFanins[i] == iFan )
            break;
    pFanins[i] = iFan;
    pFaninCounts[i]++;
    return nFanins + (i == nFanins);
}